

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageMultisampleLoadStoreTests.cpp
# Opt level: O1

TestCaseGroup * vkt::image::createImageMultisampleLoadStoreTests(TestContext *testCtx)

{
  VkFormat VVar1;
  int samples;
  TestContext *testCtx_00;
  uint uVar2;
  TestNode *this;
  TestNode *this_00;
  long *plVar3;
  TestNode *this_01;
  TestNode *node;
  long *plVar4;
  ImageType imageType;
  char *__end;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  string formatGroupName;
  string samplesCaseName;
  CaseDef caseDef;
  Texture textures [2];
  long local_2a0;
  long *local_298 [2];
  long local_288 [2];
  int local_274;
  undefined8 local_270;
  undefined1 local_268;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  TestContext *local_240;
  Texture *local_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  undefined8 local_210;
  undefined4 local_208;
  pointer local_200;
  undefined4 local_1f8;
  long local_1f0;
  ulong local_1e8;
  string local_1e0;
  undefined1 local_1c0;
  ios_base local_170 [264];
  Texture local_68 [2];
  
  local_1e0._M_dataplus._M_p = (pointer)0x2000000020;
  local_1e0._M_string_length._0_4_ = 1;
  Texture::Texture(local_68,IMAGE_TYPE_2D,(IVec3 *)&local_1e0,1,1);
  local_260 = (long *)0x2000000020;
  local_258 = CONCAT44(local_258._4_4_,1);
  Texture::Texture(local_68 + 1,IMAGE_TYPE_2D_ARRAY,(IVec3 *)&local_260,4,1);
  this = (TestNode *)operator_new(0x70);
  local_240 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"load_store_multisample",
             "Multisampled image store and load");
  local_2a0 = 0;
  do {
    this_00 = (TestNode *)operator_new(0x70);
    local_238 = local_68 + local_2a0;
    getImageTypeName_abi_cxx11_(&local_1e0,(image *)(ulong)local_68[local_2a0].m_type,imageType);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,local_240,local_1e0._M_dataplus._M_p,"");
    uVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,
                      CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                               local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
      uVar5 = extraout_RDX_00;
    }
    local_274 = local_238->m_numLayers;
    lVar6 = 0;
    do {
      VVar1 = createImageMultisampleLoadStoreTests::formats[lVar6];
      uVar2 = 0;
      local_1f0 = lVar6;
      do {
        getFormatShortString_abi_cxx11_(&local_1e0,(image *)(ulong)VVar1,(VkFormat)uVar5);
        local_1e8 = (ulong)uVar2;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        local_260 = &local_250;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_250 = *plVar4;
          lStack_248 = plVar3[3];
        }
        else {
          local_250 = *plVar4;
          local_260 = (long *)*plVar3;
        }
        local_258 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,
                          CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                   local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
        }
        this_01 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_01,local_240,(char *)local_260,"");
        lVar6 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1e0);
          samples = *(int *)((long)createImageMultisampleLoadStoreTests::samples + lVar6);
          std::ostream::operator<<(&local_1e0,samples);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1e0);
          std::ios_base::~ios_base(local_170);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0xb118e3);
          local_230 = &local_220;
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_220 = *plVar4;
            lStack_218 = plVar3[3];
          }
          else {
            local_220 = *plVar4;
            local_230 = (long *)*plVar3;
          }
          local_228 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if (local_298[0] != local_288) {
            operator_delete(local_298[0],local_288[0] + 1);
          }
          Texture::Texture((Texture *)&local_1e0,local_238,samples);
          local_298[0] = local_288;
          local_1e0.field_2._8_4_ = VVar1;
          local_1e0.field_2._12_4_ = samples;
          local_1c0 = uVar2 != 0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"");
          local_208 = local_1e0.field_2._M_allocated_capacity._4_4_;
          local_210 = CONCAT44(local_1e0.field_2._M_allocated_capacity._0_4_,
                               local_1e0._M_string_length._4_4_);
          local_268 = local_1c0;
          local_270 = CONCAT44(local_1e0.field_2._12_4_,local_1e0.field_2._8_4_);
          testCtx_00 = this_01->m_testCtx;
          node = (TestNode *)operator_new(0xa8);
          local_1f8 = (undefined4)local_1e0._M_string_length;
          local_200 = local_1e0._M_dataplus._M_p;
          tcu::TestCase::TestCase
                    ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)local_230,
                     (char *)local_298[0]);
          node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d62860;
          node[1]._vptr_TestNode = (_func_int **)anon_unknown_1::initPrograms;
          node[1].m_testCtx = (TestContext *)anon_unknown_1::test;
          *(undefined4 *)&node[1].m_name._M_string_length = local_1f8;
          node[1].m_name._M_dataplus._M_p = local_200;
          *(undefined8 *)((long)&node[1].m_name._M_string_length + 4) = local_210;
          *(undefined4 *)((long)&node[1].m_name.field_2 + 4) = local_208;
          *(undefined8 *)((long)&node[1].m_name.field_2 + 8) = local_270;
          *(undefined1 *)&node[1].m_description._M_dataplus._M_p = local_268;
          tcu::TestNode::addChild(this_01,node);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0],local_288[0] + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,local_220 + 1);
          }
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0x18);
        tcu::TestNode::addChild(this_00,this_01);
        uVar5 = extraout_RDX_01;
        if (local_260 != &local_250) {
          operator_delete(local_260,local_250 + 1);
          uVar5 = extraout_RDX_02;
        }
      } while ((local_274 != 1) && (uVar2 = (int)local_1e8 + 1, (int)local_1e8 == 0));
      lVar6 = local_1f0 + 1;
    } while (lVar6 != 0xd);
    tcu::TestNode::addChild(this,this_00);
    bVar7 = local_2a0 == 0;
    local_2a0 = local_2a0 + 1;
  } while (bVar7);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createImageMultisampleLoadStoreTests (tcu::TestContext& testCtx)
{
	const Texture textures[] =
	{
		// \note Shader code is tweaked to work with image size of 32, take a look if this needs to be modified.
		Texture(IMAGE_TYPE_2D,			tcu::IVec3(32,	32,	1),		1),
		Texture(IMAGE_TYPE_2D_ARRAY,	tcu::IVec3(32,	32,	1),		4),
	};

	static const VkFormat formats[] =
	{
		VK_FORMAT_R32G32B32A32_SFLOAT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_SFLOAT,

		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R32_UINT,

		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_R32_SINT,

		VK_FORMAT_R8G8B8A8_UNORM,

		VK_FORMAT_R8G8B8A8_SNORM,
	};

	static const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT,
	};

	MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "load_store_multisample", "Multisampled image store and load"));

	for (int baseTextureNdx = 0; baseTextureNdx < DE_LENGTH_OF_ARRAY(textures); ++baseTextureNdx)
	{
		const Texture&				baseTexture			= textures[baseTextureNdx];
		MovePtr<tcu::TestCaseGroup>	imageViewGroup		(new tcu::TestCaseGroup(testCtx, getImageTypeName(baseTexture.type()).c_str(), ""));
		const int					numLayerBindModes	= (baseTexture.numLayers() == 1 ? 1 : 2);

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		for (int layerBindMode = 0; layerBindMode < numLayerBindModes; ++layerBindMode)
		{
			const bool					singleLayerBind	= (layerBindMode != 0);
			const std::string			formatGroupName	= getFormatShortString(formats[formatNdx]) + (singleLayerBind ? "_single_layer" : "");
			MovePtr<tcu::TestCaseGroup>	formatGroup		(new tcu::TestCaseGroup(testCtx, formatGroupName.c_str(), ""));

			for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); ++samplesNdx)
			{
				const std::string	samplesCaseName = "samples_" + de::toString(samples[samplesNdx]);

				const CaseDef		caseDef =
				{
					Texture(baseTexture, samples[samplesNdx]),
					formats[formatNdx],
					samples[samplesNdx],
					singleLayerBind,
				};

				addFunctionCaseWithPrograms(formatGroup.get(), samplesCaseName, "", initPrograms, test, caseDef);
			}
			imageViewGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageViewGroup.release());
	}

	return testGroup.release();
}